

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_widget.c
# Opt level: O2

void menu_widget_layer_update(ugui_layer_t *layer,void *graphics_ctx,void *layer_ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ugui_rect_t *puVar5;
  uint8_t i;
  byte bVar6;
  undefined1 local_118 [8];
  char header [64];
  char title [64];
  char data [64];
  ugui_point_t local_38;
  ugui_size_t local_34;
  
  puVar5 = ugui_layer_get_bounds(layer);
  iVar1 = (**(code **)((long)layer_ctx + 0x30))(layer_ctx,*(undefined8 *)((long)layer_ctx + 0x58));
  iVar2 = (**(code **)((long)layer_ctx + 8))(layer_ctx,*(undefined8 *)((long)layer_ctx + 0x58));
  iVar3 = (**(code **)((long)layer_ctx + 0x10))(layer_ctx,*(undefined8 *)((long)layer_ctx + 0x58));
  iVar4 = (int)((uint)puVar5->h - iVar2) / iVar3;
  if (iVar1 < iVar4) {
    iVar4 = iVar1;
  }
  local_38 = (ugui_point_t)((uint)local_38.y << 0x10);
  local_34.h = (uint16_t)iVar3;
  local_34.w = puVar5->w;
  (**(code **)((long)layer_ctx + 0x38))(layer_ctx,local_118);
  (**(code **)((long)layer_ctx + 0x18))(graphics_ctx,puVar5,local_118);
  for (bVar6 = 0; (int)(uint)bVar6 < iVar4; bVar6 = bVar6 + 1) {
    local_38.y = (uint16_t)iVar3 * (ushort)bVar6 + (short)iVar2;
    (**(code **)((long)layer_ctx + 0x40))
              (layer_ctx,*(int *)((long)layer_ctx + 0x54) + (uint)bVar6 & 0xffff,header + 0x38,
               title + 0x38);
    (**(code **)((long)layer_ctx + 0x20))(graphics_ctx,&local_38,header + 0x38,title + 0x38);
    if ((uint)bVar6 + *(int *)((long)layer_ctx + 0x54) == *(int *)((long)layer_ctx + 0x50)) {
      ugui_graphics_inverse_rect((ugui_graphics_t *)graphics_ctx,local_38,local_34);
    }
  }
  return;
}

Assistant:

static void menu_widget_layer_update(ugui_layer_t* layer, void* graphics_ctx, void* layer_ctx)
{
	ugui_menu_widget_t* menu_widget = (ugui_menu_widget_t*) layer_ctx;
	ugui_rect_t* bounds = ugui_layer_get_bounds(layer);

	int32_t num_rows = menu_widget->data_callbacks.get_num_rows(menu_widget, menu_widget->data);
	int32_t header_height = menu_widget->draw_callbacks.get_header_height(menu_widget, menu_widget->data);
	int32_t row_height = menu_widget->draw_callbacks.get_cell_height(menu_widget, menu_widget->data);

	int32_t max_rows = (bounds->h - header_height) / row_height;
	int32_t min_rows = (num_rows < max_rows) ? num_rows : max_rows;

	ugui_rect_t cell_bounds;
	cell_bounds.x = 0;
	cell_bounds.y = header_height;
	cell_bounds.w = bounds->w;
	cell_bounds.h = row_height;

	char header[64];
	char title[64];
	char data[64];

	//Draw header
	menu_widget->data_callbacks.get_header(menu_widget, header);
	menu_widget->draw_callbacks.draw_header(graphics_ctx, bounds, header);

	//Draw cells
	//TODO: support for 2d cells
	for (uint8_t i = 0; i < min_rows; i++) {
		//Calculate row offset in pixels
		cell_bounds.y = header_height + i * row_height;

		menu_widget->data_callbacks.get_data(menu_widget, i + menu_widget->offset, title, data);
		menu_widget->draw_callbacks.draw_row(graphics_ctx, &cell_bounds, title, data);

		//Highlight selected cell
		if ((i + menu_widget->offset) == menu_widget->selected) {
			ugui_graphics_inverse_rect(graphics_ctx,
			(ugui_point_t) {.x = cell_bounds.x, .y = cell_bounds.y},
			(ugui_size_t) {.w = cell_bounds.w, .h = cell_bounds.h});
		}
	}
}